

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::xml_node::print
          (xml_node *this,xml_writer *writer,char_t *indent,uint flags,xml_encoding encoding,
          uint depth)

{
  long *in_RDI;
  xml_buffered_writer buffered_writer;
  undefined4 in_stack_ffffffffffffd7c0;
  xml_encoding in_stack_ffffffffffffd7c4;
  xml_writer *in_stack_ffffffffffffd7c8;
  xml_buffered_writer *in_stack_ffffffffffffd7d0;
  uint in_stack_ffffffffffffd7d8;
  uint in_stack_ffffffffffffd7dc;
  char_t *in_stack_ffffffffffffd7e0;
  xml_node_struct *in_stack_ffffffffffffd7e8;
  xml_buffered_writer *in_stack_ffffffffffffd7f0;
  
  if (*in_RDI != 0) {
    impl::anon_unknown_0::xml_buffered_writer::xml_buffered_writer
              (in_stack_ffffffffffffd7d0,in_stack_ffffffffffffd7c8,in_stack_ffffffffffffd7c4);
    impl::anon_unknown_0::node_output
              (in_stack_ffffffffffffd7f0,in_stack_ffffffffffffd7e8,in_stack_ffffffffffffd7e0,
               in_stack_ffffffffffffd7dc,in_stack_ffffffffffffd7d8);
    impl::anon_unknown_0::xml_buffered_writer::flush
              ((xml_buffered_writer *)CONCAT44(in_stack_ffffffffffffd7c4,in_stack_ffffffffffffd7c0))
    ;
  }
  return;
}

Assistant:

PUGI_IMPL_FN void xml_node::print(xml_writer& writer, const char_t* indent, unsigned int flags, xml_encoding encoding, unsigned int depth) const
	{
		if (!_root) return;

		impl::xml_buffered_writer buffered_writer(writer, encoding);

		impl::node_output(buffered_writer, _root, indent, flags, depth);

		buffered_writer.flush();
	}